

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Utility.cpp
# Opt level: O1

void __thiscall UtilityTest_Pack16Test_Test::TestBody(UtilityTest_Pack16Test_Test *this)

{
  char *pcVar1;
  size_t offset3;
  AssertionResult gtest_ar;
  size_t offset2;
  uint8_t data1 [2];
  uint8_t data2 [4];
  uint8_t data3 [6];
  size_t offset1;
  AssertHelper local_50;
  AssertHelper local_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  AssertHelper local_28;
  uint8_t local_1e;
  uchar local_1d;
  uint8_t local_1c [8];
  uchar local_14 [4];
  size_t local_10;
  
  local_10 = Pack16(&local_1e,0,0xabcd);
  local_30._M_head_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_40,"offset1","2",&local_10,(int *)&local_30);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test/tinytcp/test_Utility.cpp"
               ,0x4f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_30._M_head_impl._0_4_ = 0xab;
  testing::internal::CmpHelperEQ<unsigned_char,int>
            (local_40,"data1[0]","0xAB",&local_1e,(int *)&local_30);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test/tinytcp/test_Utility.cpp"
               ,0x50,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_30._M_head_impl._0_4_ = 0xcd;
  testing::internal::CmpHelperEQ<unsigned_char,int>
            (local_40,"data1[1]","0xCD",&local_1d,(int *)&local_30);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test/tinytcp/test_Utility.cpp"
               ,0x51,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_1c[0] = '\0';
  local_1c[1] = '\0';
  local_1c[2] = '\0';
  local_1c[3] = '\0';
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Pack16(local_1c,1,0x3456);
  local_50.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_40,"offset2","3",(unsigned_long *)&local_30,(int *)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test/tinytcp/test_Utility.cpp"
               ,0x56,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_50.data_ + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_50.data_._0_4_ = 0x34;
  testing::internal::CmpHelperEQ<unsigned_char,int>
            (local_40,"data2[1]","0x34",(uchar *)((long)local_1c + 1),(int *)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test/tinytcp/test_Utility.cpp"
               ,0x57,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_50.data_ + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_50.data_._0_4_ = 0x56;
  testing::internal::CmpHelperEQ<unsigned_char,int>
            (local_40,"data2[2]","0x56",(uchar *)((long)local_1c + 2),(int *)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test/tinytcp/test_Utility.cpp"
               ,0x58,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_50.data_ + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_14[0] = '\0';
  local_14[1] = '\0';
  local_1c[4] = '\0';
  local_1c[5] = '\0';
  local_1c[6] = '\0';
  local_1c[7] = '\0';
  local_50.data_ = (AssertHelperData *)Pack16((uint8_t *)((long)local_1c + 4),3,0x4455);
  local_48.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_40,"offset3","5",(unsigned_long *)&local_50,(int *)&local_48);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test/tinytcp/test_Utility.cpp"
               ,0x5d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(local_48.data_._4_4_,local_48.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_48.data_._4_4_,local_48.data_._0_4_) + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_48.data_._0_4_ = 0x44;
  testing::internal::CmpHelperEQ<unsigned_char,int>
            (local_40,"data3[3]","0x44",local_1c + 7,(int *)&local_48);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test/tinytcp/test_Utility.cpp"
               ,0x5e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(local_48.data_._4_4_,local_48.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_48.data_._4_4_,local_48.data_._0_4_) + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_48.data_._0_4_ = 0x55;
  testing::internal::CmpHelperEQ<unsigned_char,int>
            (local_40,"data3[4]","0x55",local_14,(int *)&local_48);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test/tinytcp/test_Utility.cpp"
               ,0x5f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(local_48.data_._4_4_,local_48.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_48.data_._4_4_,local_48.data_._0_4_) + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  return;
}

Assistant:

TEST(UtilityTest, Pack16Test) {
    // Test case 1: Packing a single byte
    uint8_t data1[2];
    size_t offset1 = Pack16(data1, 0, 0xABCD);
    EXPECT_EQ(offset1, 2);
    EXPECT_EQ(data1[0], 0xAB);
    EXPECT_EQ(data1[1], 0xCD);

    // Test case 2: Packing a byte at a non-zero offset
    uint8_t data2[4] = {0x00, 0x00, 0x00, 0x00};
    size_t offset2 = Pack16(data2, 1, 0x3456);
    EXPECT_EQ(offset2, 3);
    EXPECT_EQ(data2[1], 0x34);
    EXPECT_EQ(data2[2], 0x56);

    // Test case 3: Packing a byte in a larger array
    uint8_t data3[6] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
    size_t offset3 = Pack16(data3, 3, 0x4455);
    EXPECT_EQ(offset3, 5);
    EXPECT_EQ(data3[3], 0x44);
    EXPECT_EQ(data3[4], 0x55);
}